

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joysticks.c
# Opt level: O2

int main(void)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  float *pfVar6;
  uchar *puVar7;
  uchar *puVar8;
  byte bVar9;
  uchar state_00;
  undefined8 uVar10;
  ulong uVar11;
  int *piVar12;
  GLFWgamepadstate *pGVar13;
  nk_rect bounds;
  nk_rect bounds_00;
  int hat_count;
  int button_count;
  int hat_buttons;
  int axis_count;
  int height;
  int width;
  long local_70;
  GLFWgamepadstate state;
  nk_font_atlas *atlas;
  
  hat_buttons = 0;
  joysticks[0] = 0;
  joysticks[1] = 0;
  joysticks[2] = 0;
  joysticks[3] = 0;
  joysticks[4] = 0;
  joysticks[5] = 0;
  joysticks[6] = 0;
  joysticks[7] = 0;
  joysticks[8] = 0;
  joysticks[9] = 0;
  joysticks[10] = 0;
  joysticks[0xb] = 0;
  joysticks[0xc] = 0;
  joysticks[0xd] = 0;
  joysticks[0xe] = 0;
  joysticks[0xf] = 0;
  glfwSetErrorCallback(error_callback);
  iVar2 = glfwInit();
  if (iVar2 != 0) {
    glfwWindowHint(0x2200c,1);
    iVar2 = 0;
    window = glfwCreateWindow(800,600,"Joystick Test",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    if (window != (GLFWwindow *)0x0) {
      glfwMakeContextCurrent(window);
      gladLoadGL(glfwGetProcAddress);
      glfwSwapInterval(1);
      nk_glfw3_init(window,NK_GLFW3_INSTALL_CALLBACKS);
      nk_glfw3_font_stash_begin(&atlas);
      nk_glfw3_font_stash_end();
      for (; iVar2 != 0x10; iVar2 = iVar2 + 1) {
        iVar3 = glfwJoystickPresent(iVar2);
        if (iVar3 != 0) {
          lVar4 = (long)joystick_count;
          joystick_count = joystick_count + 1;
          joysticks[lVar4] = iVar2;
        }
      }
      glfwSetJoystickCallback(joystick_callback);
      glfwSetDropCallback(window,drop_callback);
      while( true ) {
        iVar2 = glfwWindowShouldClose(window);
        if (iVar2 != 0) break;
        glfwGetWindowSize(window,&width,&height);
        (*glad_glClear)(0x4000);
        nk_glfw3_new_frame();
        bounds.h = (float)height;
        bounds.w = 200.0;
        bounds.y = 0.0;
        bounds.x = (float)width + -200.0;
        iVar2 = nk_begin(&glfw.ctx,"Joysticks",bounds,0x50);
        if (iVar2 != 0) {
          nk_layout_row_dynamic(&glfw.ctx,30.0,1);
          nk_checkbox_label(&glfw.ctx,"Hat buttons",&hat_buttons);
          if (joystick_count == 0) {
            nk_label(&glfw.ctx,"No joysticks connected",0x11);
          }
          else {
            piVar12 = joysticks;
            for (lVar4 = 0; lVar4 < joystick_count; lVar4 = lVar4 + 1) {
              joystick_label(*piVar12);
              iVar2 = nk_button_label(&glfw.ctx,joystick_label::label);
              if (iVar2 != 0) {
                joystick_label(*piVar12);
                nk_window_set_focus(&glfw.ctx,joystick_label::label);
              }
              piVar12 = piVar12 + 1;
            }
          }
        }
        nk_end(&glfw.ctx);
        for (lVar4 = 0; lVar4 < joystick_count; lVar4 = lVar4 + 1) {
          joystick_label(joysticks[lVar4]);
          bounds_00.x = (float)(int)lVar4 * 20.0;
          bounds_00.y = bounds_00.x;
          bounds_00.w = 550.0;
          bounds_00.h = 570.0;
          iVar2 = nk_begin(&glfw.ctx,joystick_label::label,bounds_00,0x57);
          if (iVar2 != 0) {
            nk_layout_row_dynamic(&glfw.ctx,30.0,1);
            pcVar5 = glfwGetJoystickGUID(joysticks[lVar4]);
            nk_labelf(&glfw.ctx,0x11,"Hardware GUID %s",pcVar5);
            nk_label(&glfw.ctx,"Joystick state",0x11);
            pfVar6 = glfwGetJoystickAxes(joysticks[lVar4],&axis_count);
            puVar7 = glfwGetJoystickButtons(joysticks[lVar4],&button_count);
            local_70 = lVar4;
            puVar8 = glfwGetJoystickHats(joysticks[lVar4],&hat_count);
            if (hat_buttons == 0) {
              button_count = button_count + hat_count * -4;
            }
            for (lVar4 = 0; lVar4 < axis_count; lVar4 = lVar4 + 1) {
              nk_slide_float(&glfw.ctx,-1.0,pfVar6[lVar4],1.0,0.1);
            }
            nk_layout_row_dynamic(&glfw.ctx,30.0,0xc);
            uVar11 = 0;
            while ((long)uVar11 < (long)button_count) {
              snprintf((char *)&state,0x10,"%i",uVar11 + 1 & 0xffffffff);
              nk_select_label(&glfw.ctx,(char *)&state,0x12,(uint)puVar7[uVar11]);
              uVar11 = uVar11 + 1;
            }
            uVar10 = 8;
            nk_layout_row_dynamic(&glfw.ctx,30.0,8);
            for (lVar4 = 0; lVar4 < hat_count; lVar4 = lVar4 + 1) {
              hat_widget((nk_context *)(ulong)puVar8[lVar4],(uchar)uVar10);
            }
            nk_layout_row_dynamic(&glfw.ctx,30.0,1);
            lVar4 = local_70;
            iVar2 = glfwGetGamepadState(joysticks[local_70],&state);
            if (iVar2 == 0) {
              nk_label(&glfw.ctx,"Joystick has no gamepad mapping",0x11);
            }
            else {
              pcVar5 = glfwGetGamepadName(joysticks[lVar4]);
              nk_labelf(&glfw.ctx,0x11,"Gamepad state: %s",pcVar5);
              nk_layout_row_dynamic(&glfw.ctx,30.0,2);
              for (lVar4 = 0; lVar4 != 6; lVar4 = lVar4 + 1) {
                nk_slide_float(&glfw.ctx,-1.0,state.axes[lVar4],1.0,0.1);
              }
              nk_layout_row_dynamic(&glfw.ctx,30.0,0xb);
              pGVar13 = &state;
              for (lVar4 = 0; lVar4 != 0x2c; lVar4 = lVar4 + 4) {
                nk_select_label(&glfw.ctx,
                                (char *)((long)&DAT_0015a890 +
                                        (long)*(int *)((long)&DAT_0015a890 + lVar4)),0x12,
                                (uint)pGVar13->buttons[0]);
                pGVar13 = (GLFWgamepadstate *)(pGVar13->buttons + 1);
              }
              bVar9 = (state.buttons[0xb] != '\0') + 2;
              if (state.buttons[0xc] == '\0') {
                bVar9 = state.buttons[0xb] != '\0';
              }
              bVar1 = bVar9 + 4;
              if (state.buttons[0xd] == '\0') {
                bVar1 = bVar9;
              }
              bVar9 = bVar1 | 8;
              if (state.buttons[0xe] == '\0') {
                bVar9 = bVar1;
              }
              state_00 = '\b';
              nk_layout_row_dynamic(&glfw.ctx,30.0,8);
              hat_widget((nk_context *)(ulong)bVar9,state_00);
              lVar4 = local_70;
            }
          }
          nk_end(&glfw.ctx);
        }
        nk_glfw3_render(NK_ANTI_ALIASING_ON);
        glfwSwapBuffers(window);
        glfwPollEvents();
      }
      glfwTerminate();
      exit(0);
    }
    glfwTerminate();
  }
  exit(1);
}

Assistant:

int main(void)
{
    int jid, hat_buttons = GLFW_FALSE;
    struct nk_context* nk;
    struct nk_font_atlas* atlas;

    memset(joysticks, 0, sizeof(joysticks));

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    glfwWindowHint(GLFW_SCALE_TO_MONITOR, GLFW_TRUE);

    window = glfwCreateWindow(800, 600, "Joystick Test", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwMakeContextCurrent(window);
    gladLoadGL(glfwGetProcAddress);
    glfwSwapInterval(1);

    nk = nk_glfw3_init(window, NK_GLFW3_INSTALL_CALLBACKS);
    nk_glfw3_font_stash_begin(&atlas);
    nk_glfw3_font_stash_end();

    for (jid = GLFW_JOYSTICK_1;  jid <= GLFW_JOYSTICK_LAST;  jid++)
    {
        if (glfwJoystickPresent(jid))
            joysticks[joystick_count++] = jid;
    }

    glfwSetJoystickCallback(joystick_callback);
    glfwSetDropCallback(window, drop_callback);

    while (!glfwWindowShouldClose(window))
    {
        int i, width, height;

        glfwGetWindowSize(window, &width, &height);

        glClear(GL_COLOR_BUFFER_BIT);
        nk_glfw3_new_frame();

        if (nk_begin(nk,
                     "Joysticks",
                     nk_rect(width - 200.f, 0.f, 200.f, (float) height),
                     NK_WINDOW_MINIMIZABLE |
                     NK_WINDOW_TITLE))
        {
            nk_layout_row_dynamic(nk, 30, 1);

            nk_checkbox_label(nk, "Hat buttons", &hat_buttons);

            if (joystick_count)
            {
                for (i = 0;  i < joystick_count;  i++)
                {
                    if (nk_button_label(nk, joystick_label(joysticks[i])))
                        nk_window_set_focus(nk, joystick_label(joysticks[i]));
                }
            }
            else
                nk_label(nk, "No joysticks connected", NK_TEXT_LEFT);
        }

        nk_end(nk);

        for (i = 0;  i < joystick_count;  i++)
        {
            if (nk_begin(nk,
                         joystick_label(joysticks[i]),
                         nk_rect(i * 20.f, i * 20.f, 550.f, 570.f),
                         NK_WINDOW_BORDER |
                         NK_WINDOW_MOVABLE |
                         NK_WINDOW_SCALABLE |
                         NK_WINDOW_MINIMIZABLE |
                         NK_WINDOW_TITLE))
            {
                int j, axis_count, button_count, hat_count;
                const float* axes;
                const unsigned char* buttons;
                const unsigned char* hats;
                GLFWgamepadstate state;

                nk_layout_row_dynamic(nk, 30, 1);
                nk_labelf(nk, NK_TEXT_LEFT, "Hardware GUID %s",
                          glfwGetJoystickGUID(joysticks[i]));
                nk_label(nk, "Joystick state", NK_TEXT_LEFT);

                axes = glfwGetJoystickAxes(joysticks[i], &axis_count);
                buttons = glfwGetJoystickButtons(joysticks[i], &button_count);
                hats = glfwGetJoystickHats(joysticks[i], &hat_count);

                if (!hat_buttons)
                    button_count -= hat_count * 4;

                for (j = 0;  j < axis_count;  j++)
                    nk_slide_float(nk, -1.f, axes[j], 1.f, 0.1f);

                nk_layout_row_dynamic(nk, 30, 12);

                for (j = 0;  j < button_count;  j++)
                {
                    char name[16];
                    snprintf(name, sizeof(name), "%i", j + 1);
                    nk_select_label(nk, name, NK_TEXT_CENTERED, buttons[j]);
                }

                nk_layout_row_dynamic(nk, 30, 8);

                for (j = 0;  j < hat_count;  j++)
                    hat_widget(nk, hats[j]);

                nk_layout_row_dynamic(nk, 30, 1);

                if (glfwGetGamepadState(joysticks[i], &state))
                {
                    int hat = 0;
                    const char* names[GLFW_GAMEPAD_BUTTON_LAST + 1 - 4] =
                    {
                        "A", "B", "X", "Y",
                        "LB", "RB",
                        "Back", "Start", "Guide",
                        "LT", "RT",
                    };

                    nk_labelf(nk, NK_TEXT_LEFT,
                              "Gamepad state: %s",
                              glfwGetGamepadName(joysticks[i]));

                    nk_layout_row_dynamic(nk, 30, 2);

                    for (j = 0;  j <= GLFW_GAMEPAD_AXIS_LAST;  j++)
                        nk_slide_float(nk, -1.f, state.axes[j], 1.f, 0.1f);

                    nk_layout_row_dynamic(nk, 30, GLFW_GAMEPAD_BUTTON_LAST + 1 - 4);

                    for (j = 0;  j <= GLFW_GAMEPAD_BUTTON_LAST - 4;  j++)
                        nk_select_label(nk, names[j], NK_TEXT_CENTERED, state.buttons[j]);

                    if (state.buttons[GLFW_GAMEPAD_BUTTON_DPAD_UP])
                        hat |= GLFW_HAT_UP;
                    if (state.buttons[GLFW_GAMEPAD_BUTTON_DPAD_RIGHT])
                        hat |= GLFW_HAT_RIGHT;
                    if (state.buttons[GLFW_GAMEPAD_BUTTON_DPAD_DOWN])
                        hat |= GLFW_HAT_DOWN;
                    if (state.buttons[GLFW_GAMEPAD_BUTTON_DPAD_LEFT])
                        hat |= GLFW_HAT_LEFT;

                    nk_layout_row_dynamic(nk, 30, 8);
                    hat_widget(nk, hat);
                }
                else
                    nk_label(nk, "Joystick has no gamepad mapping", NK_TEXT_LEFT);
            }

            nk_end(nk);
        }

        nk_glfw3_render(NK_ANTI_ALIASING_ON);

        glfwSwapBuffers(window);
        glfwPollEvents();
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}